

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

FileName * __thiscall
embree::FileName::operator+(FileName *__return_storage_ptr__,FileName *this,string *other)

{
  FileName local_38;
  
  FileName(&local_38,other);
  operator+(__return_storage_ptr__,this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::operator +( const std::string& other ) const {
    return operator+(FileName(other));
  }